

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.h
# Opt level: O1

void __thiscall vmgram_tok_info::~vmgram_tok_info(vmgram_tok_info *this)

{
  long lVar1;
  
  if (this->typ == '\x03') {
    lVar1 = 8;
  }
  else {
    if (this->typ != '\x06') {
      return;
    }
    lVar1 = 0x10;
  }
  free(*(void **)((long)&this->prop + lVar1));
  return;
}

Assistant:

~vmgram_tok_info()
    {
        switch (typ)
        {
        case VMGRAM_MATCH_LITERAL:
            t3free(typinfo.lit.str);
            break;

        case VMGRAM_MATCH_NSPEECH:
            t3free(typinfo.nspeech.props);
            break;
        }
    }